

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lyb.c
# Opt level: O3

ly_bool lyb_has_schema_model(lysc_node *node,lys_module **models)

{
  lys_module **pplVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  
  plVar2 = (lys_module *)0x0;
  while( true ) {
    if (models == (lys_module **)0x0) {
      plVar3 = (lys_module *)0x0;
    }
    else {
      plVar3 = models[-1];
    }
    if (plVar3 <= plVar2) break;
    pplVar1 = models + (long)plVar2;
    plVar2 = (lys_module *)((long)&plVar2->ctx + 1);
    if (node->module == *pplVar1) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

ly_bool
lyb_has_schema_model(const struct lysc_node *node, const struct lys_module **models)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(models, u) {
        if (node->module == models[u]) {
            return 1;
        }
    }

    return 0;
}